

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall irr::video::COpenGL3DriverBase::initVersion(COpenGL3DriverBase *this)

{
  undefined4 uVar1;
  long *in_RDI;
  double __x;
  uchar *unaff_retaddr;
  string<char> *in_stack_00000008;
  
  (*GL.GetString)(0x1f02);
  core::string<char>::operator=(in_stack_00000008,unaff_retaddr);
  CNullDriver::printVersion(&this->super_CNullDriver);
  (*GL.GetString)(0x1f00);
  core::string<char>::operator=(in_stack_00000008,unaff_retaddr);
  core::string<char>::c_str((string<char> *)0x35cfd5);
  os::Printer::log(__x);
  uVar1 = (**(code **)(*in_RDI + 0x420))();
  *(undefined4 *)(in_RDI + 0xbc) = uVar1;
  return;
}

Assistant:

void COpenGL3DriverBase::initVersion()
{
	Name = GL.GetString(GL_VERSION);
	printVersion();

	// print renderer information
	VendorName = GL.GetString(GL_VENDOR);
	os::Printer::log("Vendor", VendorName.c_str(), ELL_INFORMATION);

	Version = getVersionFromOpenGL();
}